

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionResult::AssertionResult
          (AssertionResult *this,AssertionInfo *info,AssertionResultData *data)

{
  void *in_RSI;
  AssertionResultData *in_RDI;
  AssertionResultData *unaff_retaddr;
  
  memcpy(in_RDI,in_RSI,0x38);
  AssertionResultData::AssertionResultData(unaff_retaddr,in_RDI);
  return;
}

Assistant:

AssertionResult::AssertionResult( AssertionInfo const& info, AssertionResultData const& data )
    :   m_info( info ),
        m_resultData( data )
    {}